

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

string * om::etc::format_timestamp(string *__return_storage_ptr__,uint timestamp_,string *format_)

{
  tm *__tmb;
  char *__fmt;
  _Put_time<char> __f;
  stringstream local_1b0 [8];
  stringstream ss;
  basic_ostream<char,_std::char_traits<char>_> local_1a0 [376];
  ulong local_28;
  time_t time;
  string *format__local;
  string *psStack_10;
  uint timestamp__local;
  
  local_28 = (ulong)timestamp_;
  time = (time_t)format_;
  format__local._4_4_ = timestamp_;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  __tmb = gmtime((time_t *)&local_28);
  __fmt = (char *)std::__cxx11::string::c_str();
  __f = std::put_time<char>((tm *)__tmb,__fmt);
  std::operator<<(local_1a0,__f);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_timestamp(unsigned timestamp_,
			const std::string& format_ = "%F %T")
        {
		    auto time = (std::time_t) timestamp_;
		    std::stringstream ss;
		    ss << std::put_time(std::gmtime(&time), format_.c_str());
		    return ss.str();
        }